

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O3

bool __thiscall
miniply::PLYReader::load_binary_scalar_property(PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  bool bVar1;
  char *pcVar2;
  ulong __n;
  
  __n = (ulong)*(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
  pcVar2 = this->m_pos;
  if ((this->m_bufEnd < pcVar2 + __n) &&
     ((bVar1 = refill_buffer(this), !bVar1 || (pcVar2 = this->m_pos, this->m_bufEnd < pcVar2 + __n))
     )) {
    this->m_valid = false;
    return false;
  }
  memcpy((this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + *destIndex,pcVar2,__n);
  pcVar2 = this->m_pos;
  this->m_pos = pcVar2 + __n;
  this->m_end = pcVar2 + __n;
  *destIndex = *destIndex + __n;
  return true;
}

Assistant:

bool PLYReader::load_binary_scalar_property(PLYProperty& prop, size_t& destIndex)
  {
    size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];
    if (m_pos + numBytes > m_bufEnd) {
      if (!refill_buffer() || m_pos + numBytes > m_bufEnd) {
        m_valid = false;
        return false;
      }
    }
    std::memcpy(m_elementData.data() + destIndex, m_pos, numBytes);
    m_pos += numBytes;
    m_end = m_pos;
    destIndex += numBytes;
    return true;
  }